

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

char * SimpleString::StrStr(char *s1,char *s2)

{
  int iVar1;
  size_t n;
  char *in_RSI;
  char *in_RDI;
  char *local_10;
  char *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDI;
  if (*in_RSI != '\0') {
    for (; *local_10 != '\0'; local_10 = local_10 + 1) {
      n = StrLen(in_RSI);
      iVar1 = StrNCmp(local_10,in_RSI,n);
      if (iVar1 == 0) {
        return local_10;
      }
    }
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* SimpleString::StrStr(const char* s1, const char* s2)
{
    if(!*s2) return s1;
    for (; *s1; s1++)
        if (StrNCmp(s1, s2, StrLen(s2)) == 0)
            return s1;
    return NULLPTR;
}